

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

Model * gvr::loadSTL(char *name,bool merge_double_vertices)

{
  undefined8 *puVar1;
  float *pfVar2;
  uint *puVar3;
  undefined8 uVar4;
  undefined1 auVar5 [16];
  int i;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  size_t sVar15;
  Mesh *this;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined7 in_register_00000031;
  ulong uVar16;
  _Link_type __x;
  bool bVar17;
  double ret;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Vector3f ret_3;
  Vector6d pose;
  string sheader;
  SVector<double,_3> ret_1;
  Matrix33d Rc;
  char header [81];
  istringstream in_1;
  ifstream in;
  undefined1 auStack_5b8 [8];
  uint local_5b0;
  uint local_5ac;
  uint local_5a8;
  uint local_5a4;
  double local_5a0;
  uint local_594;
  Mesh *local_590;
  ulong local_588;
  long local_580;
  ulong local_578;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  undefined1 local_568 [20];
  uint local_554;
  uint local_550;
  undefined4 local_54c;
  undefined1 local_548 [8];
  ulong auStack_540 [9];
  undefined1 local_4f8 [16];
  undefined1 local_4e8 [16];
  undefined1 local_4d8 [16];
  undefined1 *local_4c8 [2];
  undefined1 local_4b8 [16];
  double local_4a8 [4];
  double local_488 [4];
  undefined8 local_468 [10];
  Vector3f local_418 [6];
  undefined1 local_3c8;
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  local_3b8 [2];
  ios_base local_340 [264];
  long local_238 [3];
  undefined4 auStack_21c [123];
  long lVar21;
  
  local_54c = (undefined4)CONCAT71(in_register_00000031,merge_double_vertices);
  std::ifstream::ifstream(local_238);
  lVar14 = *(long *)(local_238[0] + -0x18);
  *(undefined4 *)((long)auStack_21c + lVar14) = 7;
  std::ios::clear((int)(auStack_5b8 + lVar14) + 0x380);
  std::ifstream::open((char *)local_238,(_Ios_Openmode)name);
  local_468[6] = 0;
  local_468[7] = 0;
  local_468[4] = 0;
  local_468[5] = 0;
  local_468[2] = 0;
  local_468[3] = 0;
  local_468[0] = 0;
  local_468[1] = 0;
  local_468[8] = 0;
  lVar14 = 0;
  local_578 = 0x8000000080000000;
  uStack_570 = 0x80000000;
  uStack_56c = 0x80000000;
  auVar19 = _DAT_00128690;
  do {
    if (SUB164(auVar19 ^ _DAT_001286a0,4) == -0x80000000 &&
        SUB164(auVar19 ^ _DAT_001286a0,0) < -0x7ffffffd) {
      *(undefined8 *)((long)local_468 + lVar14) = 0x3ff0000000000000;
      *(undefined8 *)((long)local_468 + lVar14 + 0x20) = 0x3ff0000000000000;
    }
    lVar21 = auVar19._8_8_;
    auVar19._0_8_ = auVar19._0_8_ + 2;
    auVar19._8_8_ = lVar21 + 2;
    lVar14 = lVar14 + 0x40;
  } while (lVar14 != 0x80);
  std::istream::read((char *)local_238,(long)local_418);
  local_3c8 = 0;
  local_4c8[0] = local_4b8;
  sVar15 = strlen((char *)local_418);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_4c8,local_418,(long)local_418[0].v + sVar15);
  iVar6 = std::__cxx11::string::compare((ulong)local_4c8,0,(char *)0x8);
  if (iVar6 == 0) {
    std::__cxx11::string::substr((ulong)local_548,(ulong)local_4c8);
    std::__cxx11::istringstream::istringstream((istringstream *)local_3b8,(string *)local_548,_S_in)
    ;
    if (local_548 != (undefined1  [8])(auStack_540 + 1)) {
      operator_delete((void *)local_548);
    }
    local_4d8 = (undefined1  [16])0x0;
    local_4e8 = (undefined1  [16])0x0;
    local_568._0_16_ = (undefined1  [16])0x0;
    local_4f8 = (undefined1  [16])0x0;
    gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_3b8,
                      (SVector<double,_6> *)local_4f8);
    bVar17 = *(int *)((long)&local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right +
                     *(long *)(local_3b8[0]._M_t._M_impl._0_8_ + -0x18)) == 0;
    uVar10 = (undefined4)CONCAT71((int7)((ulong)local_418 >> 8),bVar17);
    local_5a0 = 0.0;
    if (bVar17) {
      local_488[0] = (double)local_4e8._8_8_;
      local_488[1] = (double)local_4d8._0_8_;
      local_488[2] = (double)local_4d8._8_8_;
      dVar18 = 0.0;
      lVar14 = 0;
      do {
        dVar18 = dVar18 + local_488[lVar14] * local_488[lVar14];
        lVar14 = lVar14 + 1;
      } while (lVar14 != 3);
      if (dVar18 < 0.0) {
        dVar18 = sqrt(dVar18);
      }
      else {
        dVar18 = SQRT(dVar18);
      }
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        local_4a8[0] = 0.0;
        local_4a8[1] = 0.0;
        local_4a8[2] = 0.0;
        lVar14 = 0;
        do {
          local_4a8[lVar14] = local_488[lVar14] / dVar18;
          lVar14 = lVar14 + 1;
        } while (lVar14 != 3);
        gmath::createR((SVector *)local_548,dVar18);
      }
      else {
        auStack_540[5] = 0;
        auStack_540[6] = 0;
        auStack_540[3] = 0;
        auStack_540[4] = 0;
        auStack_540[1] = 0;
        auStack_540[2] = 0;
        local_548 = (undefined1  [8])0x0;
        auStack_540[0] = 0;
        auStack_540[7] = 0;
        lVar14 = 0;
        auVar20 = _DAT_00128690;
        do {
          if (SUB164(auVar20 ^ _DAT_001286a0,4) == (int)local_578 &&
              SUB164(auVar20 ^ _DAT_001286a0,0) < -0x7ffffffd) {
            *(undefined8 *)(local_548 + lVar14) = 0x3ff0000000000000;
            *(undefined8 *)((long)auStack_540 + lVar14 + 0x18U) = 0x3ff0000000000000;
          }
          lVar21 = auVar20._8_8_;
          auVar20._0_8_ = auVar20._0_8_ + 2;
          auVar20._8_8_ = lVar21 + 2;
          lVar14 = lVar14 + 0x40;
        } while (lVar14 != 0x80);
      }
      lVar14 = 0;
      do {
        *(undefined8 *)((long)local_468 + lVar14 + 0x10) =
             *(undefined8 *)((long)auStack_540 + lVar14 + 8U);
        *(undefined8 *)((long)local_468 + lVar14) = *(undefined8 *)(local_548 + lVar14);
        *(undefined8 *)((long)local_468 + lVar14 + 8) = *(undefined8 *)((long)auStack_540 + lVar14);
        lVar14 = lVar14 + 0x18;
      } while (lVar14 != 0x48);
      local_5a0 = (double)local_4e8._0_8_;
      local_568._0_16_ = local_4f8;
    }
    std::__cxx11::istringstream::~istringstream((istringstream *)local_3b8);
    std::ios_base::~ios_base(local_340);
  }
  else {
    local_568._0_16_ = (undefined1  [16])0x0;
    local_5a0 = 0.0;
    uVar10 = 0;
  }
  if (local_4c8[0] != local_4b8) {
    operator_delete(local_4c8[0]);
  }
  local_578 = CONCAT44(local_578._4_4_,uVar10);
  uVar7 = std::istream::get();
  iVar6 = std::istream::get();
  iVar8 = std::istream::get();
  iVar9 = std::istream::get();
  this = (Mesh *)operator_new(0xc0);
  Mesh::Mesh(this);
  local_554 = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
  local_588 = (ulong)local_554;
  if ((char)local_578 != '\0') {
    lVar14 = 0;
    do {
      *(undefined8 *)((long)(this->super_PointCloud).super_Model.Rc.v[0] + lVar14 + 0x10) =
           *(undefined8 *)((long)local_468 + lVar14 + 0x10);
      uVar4 = *(undefined8 *)((long)local_468 + lVar14 + 8);
      puVar1 = (undefined8 *)((long)(this->super_PointCloud).super_Model.Rc.v[0] + lVar14);
      *puVar1 = *(undefined8 *)((long)local_468 + lVar14);
      puVar1[1] = uVar4;
      lVar14 = lVar14 + 0x18;
    } while (lVar14 != 0x48);
    (this->super_PointCloud).super_Model.Tc.v[0] = (double)local_568._0_8_;
    (this->super_PointCloud).super_Model.Tc.v[1] = (double)local_568._8_8_;
    (this->super_PointCloud).super_Model.Tc.v[2] = local_5a0;
  }
  local_554 = local_554 * 3;
  (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,(ulong)local_554,0);
  (*(this->super_PointCloud).super_Model._vptr_Model[10])(this,local_588);
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_578 = 0;
  auVar5._12_4_ = 0;
  auVar5._0_12_ = local_4f8._4_12_;
  local_4f8 = auVar5 << 0x20;
  local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((int)local_588 != 0) {
    local_590 = this;
    do {
      local_418[0].v[2] = 0.0;
      local_418[0].v[0] = 0.0;
      local_418[0].v[1] = 0.0;
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      local_418[0].v[0] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      local_418[0].v[1] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      uVar7 = std::istream::get();
      iVar6 = std::istream::get();
      iVar8 = std::istream::get();
      iVar9 = std::istream::get();
      auVar19 = local_568._0_16_;
      local_418[0].v[2] = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
      if ((char)local_54c == '\0') {
        local_568._4_4_ = 0;
        local_568._0_4_ = local_4f8._0_4_;
        local_568._8_8_ = auVar19._8_8_;
        local_4f8._0_4_ = local_4f8._0_4_ + 3;
        uVar7 = std::istream::get();
        local_5a0._0_4_ = uVar7;
        uVar10 = std::istream::get();
        local_580 = CONCAT44(local_580._4_4_,uVar10);
        local_5a4 = std::istream::get();
        iVar6 = std::istream::get();
        local_5a8 = std::istream::get();
        iVar8 = std::istream::get();
        local_5ac = std::istream::get();
        iVar9 = std::istream::get();
        local_5b0 = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        lVar14 = (long)(int)local_568._0_4_;
        pfVar2 = (local_590->super_PointCloud).vertex;
        pfVar2[lVar14 * 3] =
             (float)(iVar6 << 0x18 | local_5a4 << 0x10 | (int)local_580 << 8 | local_5a0._0_4_);
        pfVar2[lVar14 * 3 + 1] = (float)(iVar9 << 0x18 | local_5ac << 0x10 | iVar8 << 8 | local_5a8)
        ;
        pfVar2[lVar14 * 3 + 2] = (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_5b0);
        local_580 = lVar14;
        uVar10 = std::istream::get();
        local_5a0 = (double)CONCAT44(local_5a0._4_4_,uVar10);
        local_5a4 = std::istream::get();
        local_5a8 = std::istream::get();
        iVar6 = std::istream::get();
        local_5ac = std::istream::get();
        iVar8 = std::istream::get();
        local_5b0 = std::istream::get();
        iVar9 = std::istream::get();
        local_594 = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        dVar18 = (double)(local_580 + 1);
        pfVar2 = (local_590->super_PointCloud).vertex;
        pfVar2[(long)dVar18 * 3] =
             (float)(iVar6 << 0x18 | local_5a8 << 0x10 | local_5a4 << 8 | local_5a0._0_4_);
        pfVar2[(long)dVar18 * 3 + 1] =
             (float)(iVar9 << 0x18 | local_5b0 << 0x10 | iVar8 << 8 | local_5ac);
        pfVar2[(long)dVar18 * 3 + 2] =
             (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_594);
        local_5a0 = dVar18;
        local_5a4 = std::istream::get();
        local_5a8 = std::istream::get();
        local_5ac = std::istream::get();
        iVar6 = std::istream::get();
        local_5b0 = std::istream::get();
        iVar8 = std::istream::get();
        local_594 = std::istream::get();
        iVar9 = std::istream::get();
        local_550 = std::istream::get();
        iVar11 = std::istream::get();
        iVar12 = std::istream::get();
        iVar13 = std::istream::get();
        uVar16 = local_580 + 2;
        pfVar2 = (local_590->super_PointCloud).vertex;
        pfVar2[uVar16 * 3] = (float)(iVar6 << 0x18 | local_5ac << 0x10 | local_5a8 << 8 | local_5a4)
        ;
        pfVar2[uVar16 * 3 + 1] = (float)(iVar9 << 0x18 | local_594 << 0x10 | iVar8 << 8 | local_5b0)
        ;
        pfVar2[uVar16 * 3 + 2] = (float)(iVar13 << 0x18 | iVar12 << 0x10 | iVar11 << 8 | local_550);
        this = local_590;
      }
      else {
        auStack_540[0] = auStack_540[0] & 0xffffffff00000000;
        local_548._0_4_ = 0.0;
        local_548._4_4_ = 0.0;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        auStack_540[0]._0_4_ = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)local_4f8,(Vector3f *)local_548,local_418);
        auVar19 = local_568._0_16_;
        local_568._4_4_ = extraout_var;
        local_568._0_4_ = uVar7;
        local_568._8_8_ = auVar19._8_8_;
        auStack_540[0]._0_4_ = 0.0;
        local_548._0_4_ = 0.0;
        local_548._4_4_ = 0.0;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        auStack_540[0]._0_4_ = (float)(iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)local_4f8,(Vector3f *)local_548,local_418);
        local_5a0 = (double)CONCAT44(extraout_var_00,uVar7);
        auStack_540[0]._0_4_ = 0.0;
        local_548._0_4_ = 0.0;
        local_548._4_4_ = 0.0;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._0_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        local_548._4_4_ = iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7;
        uVar7 = std::istream::get();
        iVar6 = std::istream::get();
        iVar8 = std::istream::get();
        iVar9 = std::istream::get();
        auStack_540[0] =
             CONCAT44(auStack_540[0]._4_4_,iVar9 << 0x18 | iVar8 << 0x10 | iVar6 << 8 | uVar7);
        uVar7 = anon_unknown_1::findOrStoreVertex
                          (this,local_3b8,(int *)local_4f8,(Vector3f *)local_548,local_418);
        uVar16 = (ulong)uVar7;
      }
      puVar3 = this->triangle;
      lVar14 = (long)(int)local_578;
      puVar3[lVar14] = local_568._0_4_;
      puVar3[lVar14 + 1] = SUB84(local_5a0,0);
      puVar3[lVar14 + 2] = (uint)uVar16;
      std::istream::ignore((long)local_238);
      std::istream::ignore((long)local_238);
      local_578 = (ulong)((int)local_578 + 3);
      uVar7 = (int)local_588 - 1;
      local_588 = (ulong)uVar7;
    } while (uVar7 != 0);
  }
  __x = (_Link_type)(ulong)(uint)local_4f8._0_4_;
  if ((int)local_4f8._0_4_ < (int)local_554) {
    (*(this->super_PointCloud).super_Model._vptr_Model[9])(this,__x,0,0);
  }
  Mesh::recalculateNormals(this);
  std::
  _Rb_tree<gvr::(anonymous_namespace)::VertexNormalIndex,_gvr::(anonymous_namespace)::VertexNormalIndex,_std::_Identity<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  ::_M_erase((_Rb_tree<gvr::(anonymous_namespace)::VertexNormalIndex,_gvr::(anonymous_namespace)::VertexNormalIndex,_std::_Identity<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
              *)local_3b8[0]._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,__x);
  std::ifstream::close();
  std::ifstream::~ifstream(local_238);
  return (Model *)this;
}

Assistant:

Model *loadSTL(const char *name, bool merge_double_vertices)
{
  Mesh *mesh=0;

  // open file

  std::ifstream in;

  in.exceptions(std::ios_base::failbit | std::ios_base::badbit | std::ios_base::eofbit);
  in.open(name, std::ios_base::binary);

  // read header

  gmath::Matrix33d Rc;
  gmath::Vector3d Tc;
  bool has_campose=false;

  {
    char header[81];

    in.read(header, 80);
    header[80]='\0';

    std::string sheader(header);

    if (sheader.compare(0, 8, "campose=") == 0)
    {
      std::istringstream in(sheader.substr(8));

      gmath::Vector6d pose;
      in >> pose;

      if (in.good())
      {
        Rc=gmath::getRotation(pose);
        Tc=gmath::getTranslation(pose);
        has_campose=true;
      }
    }
  }

  // read number of trinagles

  uint32_t n;
  n=stlReadUint32(in);

  try
  {
    // create mesh

    mesh=new Mesh();

    if (has_campose)
    {
      mesh->setDefCameraRT(Rc, Tc);
    }

    mesh->resizeVertexList(3*n, false, false);
    mesh->resizeTriangleList(n);

    std::set<VertexNormalIndex> vni;

    // read all triangles

    int vn=0;

    for (uint32_t i=0; i<n; i++)
    {
      // read triangle normal

      gmath::Vector3f tnormal=stlReadVector3f(in);

      // read vertices and either find a duplicate or add them

      unsigned int t0, t1, t2;

      if (merge_double_vertices)
      {
        t0=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t1=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
        t2=findOrStoreVertex(mesh, vni, vn, stlReadVector3f(in), tnormal);
      }
      else
      {
        t0=vn++;
        t1=vn++;
        t2=vn++;

        mesh->setVertex(t0, stlReadVector3f(in));
        mesh->setVertex(t1, stlReadVector3f(in));
        mesh->setVertex(t2, stlReadVector3f(in));
      }

      // store triangle indices

      mesh->setTriangleIndex(i, t0, t1, t2);

      // skip padding

      in.ignore(1);
      in.ignore(1);
    }

    // reduce list of vertices

    if (vn < static_cast<int>(3*n))
    {
      mesh->resizeVertexList(vn, false, false);
    }

    // calculate per vertex normals

    mesh->recalculateNormals();
  }
  catch (...)
  {
    delete mesh;
    throw;
  }

  in.close();

  return mesh;
}